

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::Bilerp(ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,
                   WrapMode2D wrapMode)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  int c;
  long lVar2;
  Float FVar3;
  
  ImageChannelValues::ImageChannelValues
            (__return_storage_ptr__,(long)(int)(this->channelNames).nStored,0.0);
  for (lVar2 = 0; lVar2 < (int)(this->channelNames).nStored; lVar2 = lVar2 + 1) {
    FVar3 = BilerpChannel(this,p,(int)lVar2,wrapMode);
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar1 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
    }
    paVar1->fixed[lVar2] = FVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::Bilerp(Point2f p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    for (int c = 0; c < NChannels(); ++c)
        cv[c] = BilerpChannel(p, c, wrapMode);
    return cv;
}